

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O2

void __thiscall
boost::deflate::deflate_stream_test::testDeflate(deflate_stream_test *this,ICompressor *c)

{
  size_t n;
  size_t n_00;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Hello, world!",&local_39);
  doMatrix(this,c,&local_38,0x108146);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Hello, world!",&local_39);
  doMatrix(this,c,&local_38,0x1083e0);
  std::__cxx11::string::~string((string *)&local_38);
  corpus1_abi_cxx11_(&local_38,(deflate_stream_test *)&DAT_00000038,n);
  doMatrix(this,c,&local_38,0x1083e0);
  std::__cxx11::string::~string((string *)&local_38);
  corpus1_abi_cxx11_(&local_38,(deflate_stream_test *)0x400,n_00);
  doMatrix(this,c,&local_38,0x108146);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void testDeflate(ICompressor& c)
    {
        doMatrix(c, "Hello, world!", &self::doDeflate1_beast);
        doMatrix(c, "Hello, world!", &self::doDeflate2_beast);
        doMatrix(c, corpus1(56), &self::doDeflate2_beast);
        doMatrix(c, corpus1(1024), &self::doDeflate1_beast);
    }